

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

bool whisper_sched_graph_init
               (whisper_sched *allocr,
               vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *backends,
               function<ggml_cgraph_*()> *get_graph)

{
  ggml_backend **ppgVar1;
  size_type sVar2;
  undefined8 uVar3;
  long lVar4;
  ggml_cgraph *pgVar5;
  ulong uVar6;
  function<ggml_cgraph_*()> *in_RSI;
  undefined8 *in_RDI;
  bool bVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *meta;
  ggml_backend_sched_t *sched;
  function<ggml_cgraph_*()> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 1);
  this = in_RSI;
  ppgVar1 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::data
                      ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x1ebae2);
  sVar2 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                    ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)in_RSI);
  uVar3 = ggml_backend_sched_new(ppgVar1,0,sVar2 & 0xffffffff,0x1000,0);
  *in_RDI = uVar3;
  lVar4 = ggml_tensor_overhead();
  sVar2 = lVar4 << 0xc;
  ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,sVar2);
  uVar3 = *in_RDI;
  pgVar5 = std::function<ggml_cgraph_*()>::operator()(this);
  uVar6 = ggml_backend_sched_alloc_graph(uVar3,pgVar5);
  bVar7 = (uVar6 & 1) != 0;
  if (bVar7) {
    ggml_backend_sched_reset(*in_RDI);
  }
  else {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate the compute buffer\n",
               "whisper_sched_graph_init");
  }
  return bVar7;
}

Assistant:

static bool whisper_sched_graph_init(struct whisper_sched & allocr, std::vector<ggml_backend_t> backends, std::function<struct ggml_cgraph *()> && get_graph) {
    auto & sched = allocr.sched;
    auto & meta  = allocr.meta;

    sched = ggml_backend_sched_new(backends.data(), nullptr, backends.size(), WHISPER_MAX_NODES, false);

    meta.resize(ggml_tensor_overhead()*WHISPER_MAX_NODES + ggml_graph_overhead());

    // since there are dependencies between the different graphs,
    // we need to allocate them instead of only reserving to get the correct compute buffer size
    if (!ggml_backend_sched_alloc_graph(sched, get_graph())) {
        // failed to allocate the compute buffer
        WHISPER_LOG_ERROR("%s: failed to allocate the compute buffer\n", __func__);
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}